

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void * fs_create_serializer
                 (char *directory,int directory_length,char *prefix,int prefix_length,char openmode)

{
  Serializer *this;
  ostream *poVar1;
  SerializerOpenMode mode;
  string prefix_str;
  string directory_str;
  
  directory_str._M_dataplus._M_p = (pointer)&directory_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&directory_str,directory,directory + directory_length);
  prefix_str._M_dataplus._M_p = (pointer)&prefix_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prefix_str,prefix,prefix + prefix_length);
  if (openmode == 'a') {
    mode = SerializerOpenModeAppend;
  }
  else {
    mode = SerializerOpenModeRead;
    if (openmode != 'r') {
      if (openmode != 'w') {
        poVar1 = std::operator<<((ostream *)&std::cerr,"Error: openmode \"");
        poVar1 = std::operator<<(poVar1,openmode);
        std::operator<<(poVar1,"\" not supported\n");
        exit(-1);
      }
      mode = SerializerOpenModeWrite;
    }
  }
  this = (Serializer *)operator_new(0xe8);
  ser::Serializer::Serializer(this);
  ser::Serializer::Init(this,&directory_str,&prefix_str,mode);
  std::__cxx11::string::~string((string *)&prefix_str);
  std::__cxx11::string::~string((string *)&directory_str);
  return this;
}

Assistant:

void* fs_create_serializer(const char* directory, int directory_length,
                           const char* prefix, int prefix_length,
                           char openmode)
{
    std::string directory_str(directory, directory_length);
    std::string prefix_str(prefix, prefix_length);

    SerializerOpenMode mode;
    switch(openmode)
    {
        case 'r':
            mode = SerializerOpenModeRead;
            break;
        case 'w':
            mode = SerializerOpenModeWrite;
            break;
        case 'a':
            mode = SerializerOpenModeAppend;
            break;
        default:
            std::cerr << "Error: openmode \"" << openmode << "\" not supported\n";
            std::exit(-1);
    }

    // Create serializer
    Serializer* pSerializer = new Serializer;
    pSerializer->Init(directory_str, prefix_str, mode);

    return reinterpret_cast<void*>(pSerializer);
}